

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

int QUtf8::compareUtf8(QByteArrayView utf8,QLatin1StringView s,CaseSensitivity cs)

{
  uchar b;
  char32_t cVar1;
  char32_t ucs4;
  qsizetype qVar2;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  uchar *end;
  long in_FS_OFFSET;
  char32_t *output;
  uchar *src1;
  char32_t uc1;
  char32_t *local_50;
  uchar *local_48;
  char32_t local_3c;
  long local_38;
  
  local_48 = (uchar *)utf8.m_data;
  pbVar3 = (byte *)s.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = L'\0';
  end = local_48 + utf8.m_size;
  pbVar5 = pbVar3 + s.m_size;
  do {
    if ((end <= local_48) || (pbVar5 <= pbVar3)) {
      iVar4 = (uint)(local_48 < end) - (uint)(pbVar3 < pbVar5);
      break;
    }
    b = *local_48;
    local_50 = &local_3c;
    local_48 = local_48 + 1;
    qVar2 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                      (b,&local_50,&local_48,end);
    if (qVar2 < 0) {
      local_3c = L'�';
    }
    ucs4 = (char32_t)*pbVar3;
    cVar1 = local_3c;
    if (cs == CaseInsensitive) {
      cVar1 = QChar::toCaseFolded(local_3c);
      local_3c = cVar1;
      ucs4 = QChar::toCaseFolded(ucs4);
    }
    pbVar3 = pbVar3 + 1;
    iVar4 = cVar1 - ucs4;
  } while (iVar4 == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QLatin1StringView s, Qt::CaseSensitivity cs)
{
    char32_t uc1 = QChar::Null;
    auto src1 = reinterpret_cast<const uchar *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const uchar *>(s.latin1());
    auto end2 = src2 + s.size();

    while (src1 < end1 && src2 < end2) {
        uchar b = *src1++;
        char32_t *output = &uc1;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        }

        char32_t uc2 = *src2++;
        if (cs == Qt::CaseInsensitive) {
            uc1 = QChar::toCaseFolded(uc1);
            uc2 = QChar::toCaseFolded(uc2);
        }
        if (uc1 != uc2)
            return int(uc1) - int(uc2);
    }

    // the shorter string sorts first
    return (end1 > src1) - (end2 > src2);
}